

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<std::pair<int,_QList<int>_>_>::moveAppend
          (QGenericArrayOps<std::pair<int,_QList<int>_>_> *this,pair<int,_QList<int>_> *b,
          pair<int,_QList<int>_> *e)

{
  qsizetype *pqVar1;
  pair<int,_QList<int>_> *ppVar2;
  
  if (b != e) {
    ppVar2 = (this->super_QArrayDataPointer<std::pair<int,_QList<int>_>_>).ptr;
    for (; b < e; b = b + 1) {
      std::pair<int,_QList<int>_>::pair
                (ppVar2 + (this->super_QArrayDataPointer<std::pair<int,_QList<int>_>_>).size,b);
      pqVar1 = &(this->super_QArrayDataPointer<std::pair<int,_QList<int>_>_>).size;
      *pqVar1 = *pqVar1 + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }